

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CMNode.hpp
# Opt level: O3

CMStateSet * __thiscall xercesc_4_0::CMNode::getLastPos(CMNode *this)

{
  CMStateSet *pCVar1;
  
  pCVar1 = this->fLastPos;
  if (pCVar1 == (CMStateSet *)0x0) {
    pCVar1 = (CMStateSet *)XMemory::operator_new(0x20,this->fMemoryManager);
    CMStateSet::CMStateSet(pCVar1,(ulong)this->fMaxStates,this->fMemoryManager);
    this->fLastPos = pCVar1;
    (*this->_vptr_CMNode[4])(this,pCVar1);
    pCVar1 = this->fLastPos;
  }
  return pCVar1;
}

Assistant:

inline const CMStateSet& CMNode::getLastPos()
{
    //
    //  Fault in the state set if needed. Since we can't use mutable members
    //  cast off the const'ness.
    //
    if (!fLastPos)
    {
        fLastPos = new (fMemoryManager) CMStateSet(fMaxStates, fMemoryManager);
        calcLastPos(*fLastPos);
    }
    return *fLastPos;
}